

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void autotest1(void)

{
  int iVar1;
  double *xpred_00;
  double *amse_00;
  FILE *__stream;
  double *inp_00;
  void *__ptr;
  void *__ptr_00;
  auto_arima_object obj_00;
  double temp2 [1200];
  double temp1 [1200];
  double temp [1200];
  FILE *ifp;
  int seasonal [3];
  int order [3];
  auto_arima_object obj;
  double *newxreg;
  double *xreg;
  double *amse;
  double *xpred;
  int r;
  int s;
  int Q;
  int P;
  int q;
  int p;
  double *inp;
  int L;
  int D;
  int d;
  int N;
  int i;
  
  seasonal[1] = 5;
  seasonal[2] = 2;
  ifp._0_4_ = 2;
  ifp._4_4_ = 1;
  seasonal[0] = 2;
  xpred_00 = (double *)malloc(0x28);
  amse_00 = (double *)malloc(0x28);
  __stream = fopen("../data/seriesA.txt","r");
  d = 0;
  if (__stream != (FILE *)0x0) {
    while (iVar1 = feof(__stream), iVar1 == 0) {
      __isoc99_fscanf(__stream,"%lf\n",temp1 + (long)d + 0x4af);
      d = d + 1;
    }
    iVar1 = d + -5;
    inp_00 = (double *)malloc((long)iVar1 << 3);
    __ptr = malloc((long)iVar1 << 4);
    __ptr_00 = malloc(0x50);
    for (d = 0; d < iVar1; d = d + 1) {
      inp_00[d] = temp1[(long)d + 0x4af];
    }
    for (d = 0; d < 5; d = d + 1) {
    }
    obj_00 = auto_arima_init(seasonal + 1,(int *)&ifp,0,0,iVar1);
    auto_arima_setApproximation(obj_00,0);
    auto_arima_setStepwise(obj_00,0);
    auto_arima_exec(obj_00,inp_00,(double *)0x0);
    auto_arima_summary(obj_00);
    auto_arima_predict(obj_00,inp_00,(double *)0x0,5,(double *)0x0,xpred_00,amse_00);
    printf("\n");
    printf("Predicted Values : ");
    for (d = 0; d < 5; d = d + 1) {
      printf("%g ",xpred_00[d]);
    }
    printf("\n");
    printf("Standard Errors  : ");
    for (d = 0; d < 5; d = d + 1) {
      sqrt(amse_00[d]);
      printf("%g ");
    }
    printf("\n");
    auto_arima_free(obj_00);
    free(inp_00);
    free(xpred_00);
    free(amse_00);
    free(__ptr);
    free(__ptr_00);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void autotest1() {
	int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	double *xpred, *amse,*xreg,*newxreg;
	auto_arima_object obj;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 5;
	d = 2;
	q = 5;
	s = 0;
	P = 2;
	D = 1;
	Q = 2;
	r = 0;
	int order[3] = {p,d,q};
	int seasonal[3] = {P,D,Q};


	L = 5;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/seriesA.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf\n", &temp[i]);
		i++;
	}
	N = i - L;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * 2);
    newxreg = (double*)malloc(sizeof(double)* L * 2);


	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        //xreg[i] = temp1[i];
		//xreg[N+i] = temp2[i];
	}

    for(i = 0; i < L;++i) {
        //newxreg[i] = temp1[N + i];
        //newxreg[i+L] = temp2[N + i];
    }

	obj = auto_arima_init(order,seasonal,s,r,N);

	auto_arima_setApproximation(obj,0);
	auto_arima_setStepwise(obj,0);

	auto_arima_exec(obj,inp,NULL);

	auto_arima_summary(obj);

	auto_arima_predict(obj, inp, NULL, L,NULL, xpred, amse);

	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");

	auto_arima_free(obj);

	
	free(inp);
	free(xpred);
	free(amse);
    free(xreg);
    free(newxreg);
}